

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O0

void google::protobuf::internal::arena_destruct_object<std::__cxx11::string>(void *object)

{
  void *object_local;
  
  std::__cxx11::string::~string((string *)object);
  return;
}

Assistant:

void arena_destruct_object(void* object) {
  reinterpret_cast<T*>(object)->~T();
}